

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O2

boolean read_scan_script(j_compress_ptr cinfo,char *filename)

{
  j_compress_ptr pjVar1;
  boolean bVar2;
  FILE *__stream;
  jpeg_scan_info *pjVar3;
  uint uVar4;
  char *__format;
  long lVar5;
  int termchar;
  long val;
  char *local_e58;
  j_compress_ptr local_e50;
  jpeg_scan_info scans [100];
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    bVar2 = 0;
    fprintf(_stderr,"Can\'t open scan definition file %s\n",filename);
  }
  else {
    pjVar3 = scans;
    uVar4 = 0;
    local_e58 = filename;
    local_e50 = cinfo;
    while( true ) {
      bVar2 = read_scan_integer((FILE *)__stream,&val,&termchar);
      pjVar1 = local_e50;
      if (bVar2 == 0) break;
      if (uVar4 == 100) {
        __format = "Too many scans defined in file %s\n";
        goto LAB_00106a7c;
      }
      pjVar3->component_index[0] = (int)val;
      lVar5 = 2;
      while (termchar == 0x20) {
        if (lVar5 == 5) {
          __format = "Too many components in one scan in file %s\n";
          goto LAB_00106a7c;
        }
        bVar2 = read_scan_integer((FILE *)__stream,&val,&termchar);
        if (bVar2 == 0) goto LAB_00106a58;
        pjVar3->component_index[lVar5 + -1] = (int)val;
        lVar5 = lVar5 + 1;
      }
      pjVar3->comps_in_scan = (int)lVar5 + -1;
      if (termchar == 0x3a) {
        bVar2 = read_scan_integer((FILE *)__stream,&val,&termchar);
        if ((bVar2 != 0) && (termchar == 0x20)) {
          pjVar3->Ss = (int)val;
          bVar2 = read_scan_integer((FILE *)__stream,&val,&termchar);
          if ((bVar2 != 0) && (termchar == 0x20)) {
            pjVar3->Se = (int)val;
            bVar2 = read_scan_integer((FILE *)__stream,&val,&termchar);
            if ((bVar2 != 0) && (termchar == 0x20)) {
              pjVar3->Ah = (int)val;
              bVar2 = read_scan_integer((FILE *)__stream,&val,&termchar);
              if (bVar2 != 0) {
                pjVar3->Al = (int)val;
                goto LAB_00106a43;
              }
            }
          }
        }
LAB_00106a58:
        __format = "Invalid scan entry format in file %s\n";
        goto LAB_00106a7c;
      }
      pjVar3->Ss = 0;
      pjVar3->Se = 0x3f;
      pjVar3->Ah = 0;
      pjVar3->Al = 0;
LAB_00106a43:
      if ((termchar != -1) && (termchar != 0x3b)) goto LAB_00106a58;
      pjVar3 = pjVar3 + 1;
      uVar4 = uVar4 + 1;
    }
    if (termchar == -1) {
      if (uVar4 != 0) {
        pjVar3 = (jpeg_scan_info *)
                 (*local_e50->mem->alloc_small)((j_common_ptr)local_e50,1,(ulong)uVar4 * 0x24);
        memcpy(pjVar3,scans,(ulong)uVar4 * 0x24);
        pjVar1->scan_info = pjVar3;
        pjVar1->num_scans = uVar4;
      }
      bVar2 = 1;
    }
    else {
      __format = "Non-numeric data in file %s\n";
LAB_00106a7c:
      bVar2 = 0;
      fprintf(_stderr,__format,local_e58);
    }
    fclose(__stream);
  }
  return bVar2;
}

Assistant:

GLOBAL(boolean)
read_scan_script(j_compress_ptr cinfo, char *filename)
/* Read a scan script from the specified text file.
 * Each entry in the file defines one scan to be emitted.
 * Entries are separated by semicolons ';'.
 * An entry contains one to four component indexes,
 * optionally followed by a colon ':' and four progressive-JPEG parameters.
 * The component indexes denote which component(s) are to be transmitted
 * in the current scan.  The first component has index 0.
 * Sequential JPEG is used if the progressive-JPEG parameters are omitted.
 * The file is free format text: any whitespace may appear between numbers
 * and the ':' and ';' punctuation marks.  Also, other punctuation (such
 * as commas or dashes) can be placed between numbers if desired.
 * Comments preceded by '#' may be included in the file.
 * Note: we do very little validity checking here;
 * jcmaster.c will validate the script parameters.
 */
{
  FILE *fp;
  int scanno, ncomps, termchar;
  long val;
  jpeg_scan_info *scanptr;
#define MAX_SCANS  100          /* quite arbitrary limit */
  jpeg_scan_info scans[MAX_SCANS];

  if ((fp = fopen(filename, "r")) == NULL) {
    fprintf(stderr, "Can't open scan definition file %s\n", filename);
    return FALSE;
  }
  scanptr = scans;
  scanno = 0;

  while (read_scan_integer(fp, &val, &termchar)) {
    if (scanno >= MAX_SCANS) {
      fprintf(stderr, "Too many scans defined in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    scanptr->component_index[0] = (int)val;
    ncomps = 1;
    while (termchar == ' ') {
      if (ncomps >= MAX_COMPS_IN_SCAN) {
        fprintf(stderr, "Too many components in one scan in file %s\n",
                filename);
        fclose(fp);
        return FALSE;
      }
      if (!read_scan_integer(fp, &val, &termchar))
        goto bogus;
      scanptr->component_index[ncomps] = (int)val;
      ncomps++;
    }
    scanptr->comps_in_scan = ncomps;
    if (termchar == ':') {
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Ss = (int)val;
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Se = (int)val;
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Ah = (int)val;
      if (!read_scan_integer(fp, &val, &termchar))
        goto bogus;
      scanptr->Al = (int)val;
    } else {
      /* set non-progressive parameters */
      scanptr->Ss = 0;
      scanptr->Se = DCTSIZE2 - 1;
      scanptr->Ah = 0;
      scanptr->Al = 0;
    }
    if (termchar != ';' && termchar != EOF) {
bogus:
      fprintf(stderr, "Invalid scan entry format in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    scanptr++, scanno++;
  }

  if (termchar != EOF) {
    fprintf(stderr, "Non-numeric data in file %s\n", filename);
    fclose(fp);
    return FALSE;
  }

  if (scanno > 0) {
    /* Stash completed scan list in cinfo structure.
     * NOTE: for cjpeg's use, JPOOL_IMAGE is the right lifetime for this data,
     * but if you want to compress multiple images you'd want JPOOL_PERMANENT.
     */
    scanptr = (jpeg_scan_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  scanno * sizeof(jpeg_scan_info));
    MEMCOPY(scanptr, scans, scanno * sizeof(jpeg_scan_info));
    cinfo->scan_info = scanptr;
    cinfo->num_scans = scanno;
  }

  fclose(fp);
  return TRUE;
}